

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  ArrayFeatureType_ArrayDataType AVar1;
  ShapeFlexibilityCase SVar2;
  DefaultOptionalValueCase DVar3;
  int32_t value;
  LogMessage *other;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *this_01;
  ArrayFeatureType_ShapeRange *from_01;
  float value_00;
  double value_01;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  ArrayFeatureType *local_18;
  ArrayFeatureType *from_local;
  ArrayFeatureType *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/FeatureTypes.pb.cc"
               ,0xbbe);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->shape_,&local_18->shape_);
  AVar1 = _internal_datatype(local_18);
  if (AVar1 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    AVar1 = _internal_datatype(local_18);
    _internal_set_datatype(this,AVar1);
  }
  SVar2 = ShapeFlexibility_case(local_18);
  if (SVar2 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar2 == kEnumeratedShapes) {
      this_00 = _internal_mutable_enumeratedshapes(this);
      from_00 = _internal_enumeratedshapes(local_18);
      ArrayFeatureType_EnumeratedShapes::MergeFrom(this_00,from_00);
    }
    else if (SVar2 == kShapeRange) {
      this_01 = _internal_mutable_shaperange(this);
      from_01 = _internal_shaperange(local_18);
      ArrayFeatureType_ShapeRange::MergeFrom(this_01,from_01);
    }
  }
  DVar3 = defaultOptionalValue_case(local_18);
  if (DVar3 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar3 == kIntDefaultValue) {
      value = _internal_intdefaultvalue(local_18);
      _internal_set_intdefaultvalue(this,value);
    }
    else if (DVar3 == kFloatDefaultValue) {
      value_00 = _internal_floatdefaultvalue(local_18);
      _internal_set_floatdefaultvalue(this,value_00);
    }
    else if (DVar3 == kDoubleDefaultValue) {
      value_01 = _internal_doubledefaultvalue(local_18);
      _internal_set_doubledefaultvalue(this,value_01);
    }
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from._internal_datatype() != 0) {
    _internal_set_datatype(from._internal_datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      _internal_mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from._internal_enumeratedshapes());
      break;
    }
    case kShapeRange: {
      _internal_mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from._internal_shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      _internal_set_intdefaultvalue(from._internal_intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      _internal_set_floatdefaultvalue(from._internal_floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      _internal_set_doubledefaultvalue(from._internal_doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}